

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitMemoryInit(PrintExpressionContents *this,MemoryInit *curr)

{
  Module *in_R8;
  Name name;
  MemoryInit *curr_local;
  PrintExpressionContents *this_local;
  
  prepareColor(this->o);
  std::operator<<(this->o,"memory.init");
  restoreNormalColor(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  std::operator<<(this->o,' ');
  wasm::Name::print(&curr->segment,this->o);
  return;
}

Assistant:

void visitMemoryInit(MemoryInit* curr) {
    prepareColor(o);
    o << "memory.init";
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    o << ' ';
    curr->segment.print(o);
  }